

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O2

CutResult QtPrivate::QContainerImplHelper::mid
                    (qsizetype originalLength,qsizetype *_position,qsizetype *_length)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = *_position;
  uVar3 = originalLength - lVar1;
  if (originalLength < lVar1) {
    *_position = 0;
    *_length = 0;
    return Null;
  }
  uVar2 = *_length;
  if (lVar1 < 0) {
    if (((long)uVar2 < 0) || (lVar1 = uVar2 + lVar1, originalLength <= lVar1)) {
      *_position = 0;
      *_length = originalLength;
      return Full;
    }
    if (lVar1 < 1) {
      *_length = 0;
      *_position = 0;
      return Null;
    }
    *_length = lVar1;
    *_position = 0;
    uVar2 = *_length;
  }
  else {
    if (uVar3 < uVar2) {
      *_length = uVar3;
      lVar1 = *_position;
      uVar2 = uVar3;
    }
    if (lVar1 != 0) goto LAB_0010b13c;
  }
  if (uVar2 == originalLength) {
    return Full;
  }
LAB_0010b13c:
  return (uint)(0 < (long)uVar2) * 2 + Empty;
}

Assistant:

static constexpr CutResult mid(qsizetype originalLength, qsizetype *_position, qsizetype *_length)
    {
        qsizetype &position = *_position;
        qsizetype &length = *_length;
        if (position > originalLength) {
            position = 0;
            length = 0;
            return Null;
        }

        if (position < 0) {
            if (length < 0 || length + position >= originalLength) {
                position = 0;
                length = originalLength;
                return Full;
            }
            if (length + position <= 0) {
                position = length = 0;
                return Null;
            }
            length += position;
            position = 0;
        } else if (size_t(length) > size_t(originalLength - position)) {
            length = originalLength - position;
        }

        if (position == 0 && length == originalLength)
            return Full;

        return length > 0 ? Subset : Empty;
    }